

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O3

void __thiscall
Nova::Arg_Data::Arg_Data
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          int default_value)

{
  string local_50;
  
  this->type = INTEGER;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  (this->val_name)._M_dataplus._M_p = (pointer)&(this->val_name).field_2;
  (this->val_name)._M_string_length = 0;
  (this->val_name).field_2._M_local_buf[0] = '\0';
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  this->boolean_value = false;
  this->integer_default = default_value;
  this->integer_value = default_value;
  this->double_default = 0.0;
  this->double_value = 0.0;
  (this->vector_2d_default)._data._M_elems[0] = 0.0;
  (this->vector_2d_default)._data._M_elems[1] = 0.0;
  (this->vector_2d_value)._data._M_elems[0] = 0.0;
  (this->vector_2d_value)._data._M_elems[1] = 0.0;
  (this->vector_3d_default)._data._M_elems[0] = 0.0;
  (this->vector_3d_default)._data._M_elems[1] = 0.0;
  (this->vector_3d_default)._data._M_elems[2] = 0.0;
  (this->vector_3d_value)._data._M_elems[0] = 0.0;
  (this->vector_3d_value)._data._M_elems[1] = 0.0;
  (this->vector_3d_value)._data._M_elems[2] = 0.0;
  (this->string_default)._M_dataplus._M_p = (pointer)&(this->string_default).field_2;
  (this->string_default)._M_string_length = 0;
  (this->string_default).field_2._M_local_buf[0] = '\0';
  (this->string_value)._M_dataplus._M_p = (pointer)&(this->string_value).field_2;
  (this->string_value)._M_string_length = 0;
  (this->string_value).field_2._M_local_buf[0] = '\0';
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"int","");
  Initialize(this,input_str,input_val_name,input_desc,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

Arg_Data(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,int default_value)
        :type(INTEGER),boolean_value(false),integer_default(default_value),integer_value(default_value),double_default(0),double_value(0)
    {
        Initialize(input_str,input_val_name,input_desc,"int");
    }